

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_groups.cxx
# Opt level: O2

void __thiscall xray_re::xr_group_object::load(xr_group_object *this,xr_reader *r)

{
  uint32_t *puVar1;
  uint __line;
  undefined8 in_RAX;
  size_t sVar2;
  char *__assertion;
  uint16_t version;
  
  version = (uint16_t)((ulong)in_RAX >> 0x30);
  sVar2 = xr_reader::r_chunk<unsigned_short>(r,0,&version);
  if (sVar2 == 0) {
    __assertion = "0";
    __line = 0x12;
  }
  else if (version == 0x11) {
    xr_custom_object::load(&this->super_xr_custom_object,r);
    xr_reader::r_chunk<unsigned_int>(r,3,(uint *)&(this->super_xr_custom_object).field_0x6c);
    if (((this->super_xr_custom_object).field_0x6c & 1) == 0) {
      xr_scene::load_objects((this->super_xr_custom_object).m_scene,r,1,&this->m_objects);
    }
    else {
      sVar2 = xr_reader::find_chunk(r,5);
      if (sVar2 != 0) {
        puVar1 = (r->field_2).m_p_u32;
        (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
        xr_reader::
        r_seq<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,xray_re::xr_reader::f_r_sz>
                  (r,*puVar1,&this->m_open_objects);
      }
    }
    if (((this->m_objects).
         super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         (this->m_objects).
         super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
         ._M_impl.super__Vector_impl_data._M_finish) ||
       ((this->m_open_objects).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->m_open_objects).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      sVar2 = xr_reader::find_chunk(r,4);
      if (sVar2 != 0) {
        xr_reader::r_sz(r,&this->m_reference);
      }
      return;
    }
    __assertion = "!m_objects.empty() || !m_open_objects.empty()";
    __line = 0x1c;
  }
  else {
    __assertion = "version == GROUPOBJ_VERSION";
    __line = 0x13;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_groups.cxx"
                ,__line,"virtual void xray_re::xr_group_object::load(xr_reader &)");
}

Assistant:

void xr_group_object::load(xr_reader& r)
{
	uint16_t version;
	if (!r.r_chunk<uint16_t>(GROUPOBJ_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == GROUPOBJ_VERSION);
	xr_custom_object::load(r);
	r.r_chunk<uint32_t>(GROUPOBJ_CHUNK_FLAGS, m_flags);
	if (m_flags & GOF_OPEN) {
		if (r.find_chunk(GROUPOBJ_CHUNK_OPEN_OBJECT_LIST))
			r.r_seq(r.r_u32(), m_open_objects, xr_reader::f_r_sz());
	} else {
		scene().load_objects(r, GROUPOBJ_CHUNK_OBJECTS, m_objects);
	}
	xr_assert(!m_objects.empty() || !m_open_objects.empty());
	if (r.find_chunk(GROUPOBJ_CHUNK_REFERENCE)) {
		r.r_sz(m_reference);
		r.debug_find_chunk();
	}
}